

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * strfmt_putquotedlen(SBuf *sb,char *s,MSize len)

{
  byte bVar1;
  char cVar2;
  byte *pbStack_a0;
  uint32_t d;
  char *w_1;
  uint32_t c;
  MSize len_local;
  char *s_local;
  SBuf *sb_local;
  byte *local_70;
  char *w_2;
  char *local_40;
  char *w;
  char *local_10;
  
  if ((int)sb->e == (int)sb->w) {
    local_10 = lj_buf_more2(sb,1);
  }
  else {
    local_10 = sb->w;
  }
  *local_10 = '\"';
  sb->w = local_10 + 1;
  w_1._4_4_ = len;
  _c = (byte *)s;
  do {
    if (w_1._4_4_ == 0) {
      if ((int)sb->e == (int)sb->w) {
        local_40 = lj_buf_more2(sb,1);
      }
      else {
        local_40 = sb->w;
      }
      *local_40 = '\"';
      sb->w = local_40 + 1;
      return sb;
    }
    bVar1 = *_c;
    w_1._0_4_ = (uint)bVar1;
    if ((uint)((int)sb->e - (int)sb->w) < 4) {
      local_70 = (byte *)lj_buf_more2(sb,4);
    }
    else {
      local_70 = (byte *)sb->w;
    }
    pbStack_a0 = local_70;
    if ((((uint)w_1 == 0x22) || ((uint)w_1 == 0x5c)) || ((uint)w_1 == 10)) {
      pbStack_a0 = local_70 + 1;
      *local_70 = 0x5c;
    }
    else if ((""[(ulong)(uint)w_1 + 1] & 1) != 0) {
      pbStack_a0 = local_70 + 1;
      *local_70 = 0x5c;
      if (((uint)w_1 < 100) && ((""[(ulong)_c[1] + 1] & 8) == 0)) {
        if (9 < (uint)w_1) goto LAB_00113688;
      }
      else {
        *pbStack_a0 = (99 < (uint)w_1) + 0x30;
        pbStack_a0 = local_70 + 2;
        if (99 < (uint)w_1) {
          w_1._0_4_ = (uint)w_1 - 100;
        }
LAB_00113688:
        cVar2 = (char)((uint)w_1 * 0xcd >> 0xb);
        *pbStack_a0 = cVar2 + 0x30;
        pbStack_a0 = pbStack_a0 + 1;
        bVar1 = (char)(uint)w_1 + cVar2 * -10;
      }
      w_1._0_1_ = bVar1;
      bVar1 = (byte)w_1 + 0x30;
    }
    w_1._0_1_ = bVar1;
    *pbStack_a0 = (byte)w_1;
    sb->w = (char *)(pbStack_a0 + 1);
    w_1._4_4_ = w_1._4_4_ - 1;
    _c = _c + 1;
  } while( true );
}

Assistant:

static SBuf *strfmt_putquotedlen(SBuf *sb, const char *s, MSize len)
{
  lj_buf_putb(sb, '"');
  while (len--) {
    uint32_t c = (uint32_t)(uint8_t)*s++;
    char *w = lj_buf_more(sb, 4);
    if (c == '"' || c == '\\' || c == '\n') {
      *w++ = '\\';
    } else if (lj_char_iscntrl(c)) {  /* This can only be 0-31 or 127. */
      uint32_t d;
      *w++ = '\\';
      if (c >= 100 || lj_char_isdigit((uint8_t)*s)) {
	*w++ = (char)('0'+(c >= 100)); if (c >= 100) c -= 100;
	goto tens;
      } else if (c >= 10) {
      tens:
	d = (c * 205) >> 11; c -= d * 10; *w++ = (char)('0'+d);
      }
      c += '0';
    }
    *w++ = (char)c;
    sb->w = w;
  }
  lj_buf_putb(sb, '"');
  return sb;
}